

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a9d::DataTransform<long_double,_short>::Run
          (DataTransform<long_double,_short> *this,istream *input_stream)

{
  ulong uVar1;
  istream *in_RSI;
  long in_RDI;
  bool bVar2;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  ostringstream error_message;
  bool is_clipped;
  short output_data;
  invalid_argument *anon_var_0;
  string word;
  longdouble input_data;
  int index;
  char buffer [128];
  ostream *in_stack_fffffffffffffce8;
  allocator *in_stack_fffffffffffffcf0;
  ostringstream *in_stack_fffffffffffffcf8;
  ostream *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  short in_stack_fffffffffffffd14;
  allocator local_291;
  string local_290 [32];
  ostringstream local_270 [328];
  ostringstream *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  int local_e8;
  string local_d8 [32];
  longdouble local_b8;
  int local_9c;
  char local_98 [128];
  istream *local_18;
  byte local_1;
  
  local_9c = 0;
  local_18 = in_RSI;
  do {
    if ((*(byte *)(in_RDI + 0x35) & 1) == 0) {
      bVar2 = sptk::ReadStream<long_double>
                        ((longdouble *)in_stack_fffffffffffffcf8,
                         (istream *)in_stack_fffffffffffffcf0);
      if (!bVar2) goto LAB_001768de;
    }
    else {
      std::__cxx11::string::string(local_d8);
      std::operator>>(local_18,local_d8);
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::stold((string *)in_stack_fffffffffffffcf0,(size_t *)in_stack_fffffffffffffce8)
        ;
        in_stack_fffffffffffffd0c = SUB104(in_ST0,0);
        in_stack_fffffffffffffd14 = (short)((unkuint10)in_ST0 >> 0x40);
        local_e8 = 0;
        lVar3 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_b8 = in_ST0;
      }
      else {
        local_e8 = 2;
        lVar3 = in_ST0;
      }
      std::__cxx11::string::~string(local_d8);
      if (local_e8 != 0) {
        if (local_e8 != 1) {
LAB_001768de:
          if (((*(byte *)(in_RDI + 0x36) & 1) != 0) && (local_9c % *(int *)(in_RDI + 0x28) != 0)) {
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
          local_1 = 1;
        }
        goto LAB_0017691a;
      }
      in_stack_fffffffffffffd08 = 0;
      in_ST0 = lVar3;
    }
    bVar2 = false;
    if (*(short *)(in_RDI + 0x38) < *(short *)(in_RDI + 0x3a)) {
      if (*(int *)(in_RDI + 0x2c) == 1) {
        if ((long)ROUND(local_b8) < (long)*(short *)(in_RDI + 0x38)) {
          bVar2 = true;
        }
        else {
          bVar2 = (long)*(short *)(in_RDI + 0x3a) < (long)ROUND(local_b8);
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 2) {
        lVar4 = (longdouble)9.223372e+18;
        lVar3 = (longdouble)0;
        if (lVar4 <= local_b8) {
          lVar3 = lVar4;
        }
        in_ST5 = in_ST4;
        in_ST6 = in_ST4;
        if (((long)ROUND(local_b8 - lVar3) ^ (ulong)(lVar4 <= local_b8) << 0x3f) <
            (ulong)(long)*(short *)(in_RDI + 0x38)) {
          bVar2 = true;
        }
        else {
          lVar4 = (longdouble)9.223372e+18;
          lVar3 = (longdouble)0;
          if (lVar4 <= local_b8) {
            lVar3 = lVar4;
          }
          bVar2 = (ulong)(long)*(short *)(in_RDI + 0x3a) <
                  ((long)ROUND(local_b8 - lVar3) ^ (ulong)(lVar4 <= local_b8) << 0x3f);
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 3) {
        in_ST6 = in_ST5;
        if ((longdouble)*(short *)(in_RDI + 0x38) <= local_b8) {
          bVar2 = (longdouble)*(short *)(in_RDI + 0x3a) < local_b8;
        }
        else {
          bVar2 = true;
        }
      }
    }
    if (((*(byte *)(in_RDI + 0x34) & 1) != 0) && (!bVar2)) {
      in_ST6 = in_ST5;
    }
    in_ST7 = in_ST6;
    if ((bVar2) && (*(int *)(in_RDI + 0x30) != 0)) {
      in_stack_fffffffffffffcf8 = local_270;
      std::__cxx11::ostringstream::ostringstream(in_stack_fffffffffffffcf8);
      in_stack_fffffffffffffd00 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffffcf8,local_9c);
      std::operator<<(in_stack_fffffffffffffd00,"th data is over the range of output type");
      in_stack_fffffffffffffcf0 = &local_291;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_290,"x2x",in_stack_fffffffffffffcf0);
      sptk::PrintErrorMessage(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      std::__cxx11::string::~string(local_290);
      std::allocator<char>::~allocator((allocator<char> *)&local_291);
      bVar2 = *(int *)(in_RDI + 0x30) == 2;
      if (bVar2) {
        local_1 = 0;
      }
      std::__cxx11::ostringstream::~ostringstream(local_270);
      if (bVar2) goto LAB_0017691a;
    }
    if ((*(byte *)(in_RDI + 0x36) & 1) == 0) {
      bVar2 = sptk::WriteStream<short>
                        ((short)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8
                        );
      if (!bVar2) {
        local_1 = 0;
LAB_0017691a:
        return (bool)(local_1 & 1);
      }
    }
    else {
      bVar2 = sptk::SnPrintf<short>
                        (in_stack_fffffffffffffd14,
                         (string *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                         (size_t)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8);
      if (!bVar2) {
        local_1 = 0;
        goto LAB_0017691a;
      }
      std::operator<<((ostream *)&std::cout,local_98);
      if ((local_9c + 1) % *(int *)(in_RDI + 0x28) == 0) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::operator<<((ostream *)&std::cout,"\t");
      }
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }